

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O2

wchar_t get_xfer_size(tree *t,wchar_t fd,char *path)

{
  int *piVar1;
  long lVar2;
  
  t->current_filesystem->xfer_align = -1;
  piVar1 = __errno_location();
  *piVar1 = 0;
  if (L'\xffffffff' < fd) {
    lVar2 = fpathconf(fd,0xe);
    t->current_filesystem->incr_xfer_size = lVar2;
    lVar2 = fpathconf(fd,0xf);
    t->current_filesystem->max_xfer_size = lVar2;
    lVar2 = fpathconf(fd,0x10);
    t->current_filesystem->min_xfer_size = lVar2;
    lVar2 = fpathconf(fd,0x11);
    t->current_filesystem->xfer_align = lVar2;
    if (lVar2 != -1) {
      return L'\0';
    }
  }
  return (uint)(*piVar1 == 0x16) * 2 + L'\xffffffff';
}

Assistant:

static int
get_xfer_size(struct tree *t, int fd, const char *path)
{
	t->current_filesystem->xfer_align = -1;
	errno = 0;
	if (fd >= 0) {
		t->current_filesystem->incr_xfer_size =
		    fpathconf(fd, _PC_REC_INCR_XFER_SIZE);
		t->current_filesystem->max_xfer_size =
		    fpathconf(fd, _PC_REC_MAX_XFER_SIZE);
		t->current_filesystem->min_xfer_size =
		    fpathconf(fd, _PC_REC_MIN_XFER_SIZE);
		t->current_filesystem->xfer_align =
		    fpathconf(fd, _PC_REC_XFER_ALIGN);
	} else if (path != NULL) {
		t->current_filesystem->incr_xfer_size =
		    pathconf(path, _PC_REC_INCR_XFER_SIZE);
		t->current_filesystem->max_xfer_size =
		    pathconf(path, _PC_REC_MAX_XFER_SIZE);
		t->current_filesystem->min_xfer_size =
		    pathconf(path, _PC_REC_MIN_XFER_SIZE);
		t->current_filesystem->xfer_align =
		    pathconf(path, _PC_REC_XFER_ALIGN);
	}
	/* At least we need an alignment size. */
	if (t->current_filesystem->xfer_align == -1)
		return ((errno == EINVAL)?1:-1);
	else
		return (0);
}